

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

void __thiscall
myvk::Buffer::UpdateData<Camera::UniformData>(Buffer *this,UniformData *data,uint32_t byte_offset)

{
  Buffer *in_RSI;
  Buffer *in_RDI;
  UniformData *in_stack_ffffffffffffffc0;
  UniformData *in_stack_ffffffffffffffc8;
  UniformData *__last;
  UniformData *in_stack_ffffffffffffffd0;
  
  if (in_RDI->m_mapped_ptr == (void *)0x0) {
    __last = (UniformData *)&in_RSI->m_mapped_ptr;
    Map(in_RSI);
    std::copy<Camera::UniformData_const*,Camera::UniformData*>
              (in_stack_ffffffffffffffd0,__last,(UniformData *)in_RSI);
    Unmap(in_RSI);
  }
  else {
    GetMappedData(in_RDI);
    std::copy<Camera::UniformData_const*,Camera::UniformData*>
              ((UniformData *)in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

inline void UpdateData(const T &data, uint32_t byte_offset = 0) const {
		if (m_mapped_ptr) {
			std::copy(&data, &data + 1, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(&data, &data + 1, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}